

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_nemotron::llm_build_nemotron
          (llm_build_nemotron *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  undefined8 uVar2;
  ggml_tensor *q_cur;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  const_reference pvVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ggml_tensor *name;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  pointer plVar12;
  void *in_RCX;
  long in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd88;
  int iVar13;
  llm_graph_context *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffd98;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffda8;
  undefined4 uVar14;
  llm_graph_context *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffde0;
  ggml_tensor *in_stack_fffffffffffffde8;
  ggml_tensor *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffe28;
  ggml_tensor *in_stack_fffffffffffffe30;
  ggml_tensor *pgVar15;
  ggml_tensor *pgVar16;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe58;
  ggml_tensor *in_stack_fffffffffffffe60;
  ggml_tensor *pgVar17;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  int il_00;
  void *pvVar18;
  ggml_tensor *in_stack_fffffffffffffe98;
  llm_graph_context *in_stack_fffffffffffffea0;
  ggml_tensor *in_stack_ffffffffffffff68;
  ggml_tensor *in_stack_ffffffffffffff70;
  ggml_tensor *local_78;
  undefined4 in_stack_ffffffffffffff98;
  int iVar19;
  ggml_tensor *v_mla;
  int il_01;
  ggml_tensor *local_48;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffda0,
             (llm_graph_params *)in_stack_fffffffffffffd98);
  uVar1 = *(uint *)(in_RDI->buffer + 0x24);
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2b68,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  q_cur = llm_graph_context::build_inp_embd(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  pgVar11 = q_cur;
  pgVar3 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffdf0);
  v_mla = pgVar3;
  pgVar4 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffe30);
  for (iVar19 = 0; iVar13 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
      (long)iVar19 < in_RDI->ne[3]; iVar19 = iVar19 + 1) {
    pgVar17 = pgVar11;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    il_01 = (int)pgVar17;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    llm_graph_context::build_norm
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd98,(llm_norm_type)((ulong)in_stack_fffffffffffffd90 >> 0x20),
               (int)in_stack_fffffffffffffd90);
    uVar14 = (undefined4)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar13);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    local_78 = llm_graph_context::build_lora_mm
                         ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                          in_stack_fffffffffffffde0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar13);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    pgVar17 = pgVar4;
    if (pvVar5->bq != (ggml_tensor *)0x0) {
      pgVar17 = in_RDI->src[5];
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar19);
      local_78 = (ggml_tensor *)ggml_add(pgVar17,local_78,pvVar5->bq);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (char *)in_stack_fffffffffffffd90,iVar13);
      pgVar17 = pgVar4;
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    pgVar4 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar13);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    if (pvVar5->bk != (ggml_tensor *)0x0) {
      pgVar6 = in_RDI->src[5];
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar19);
      pgVar4 = (ggml_tensor *)ggml_add(pgVar6,pgVar4,pvVar5->bk);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (char *)in_stack_fffffffffffffd90,iVar13);
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    pgVar6 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar13);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    if (pvVar5->bv != (ggml_tensor *)0x0) {
      pgVar16 = in_RDI->src[5];
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar19);
      pgVar6 = (ggml_tensor *)ggml_add(pgVar16,pgVar6,pvVar5->bv);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (char *)in_stack_fffffffffffffd90,iVar13);
    }
    uVar7 = ggml_reshape_3d(in_RDI->src[5],local_78,uVar1,in_RDI->nb[3],
                            (long)*(int *)(in_RDI->src + 2));
    uVar8._0_4_ = in_RDI->op;
    uVar8._4_4_ = in_RDI->op_params[0];
    uVar8 = ggml_reshape_3d(in_RDI->src[5],pgVar4,uVar1,uVar8,(long)*(int *)(in_RDI->src + 2));
    uVar2._0_4_ = in_RDI->op;
    uVar2._4_4_ = in_RDI->op_params[0];
    name = (ggml_tensor *)
           ggml_reshape_3d(in_RDI->src[5],pgVar6,uVar1,uVar2,(long)*(int *)(in_RDI->src + 2));
    ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],in_RDI->flags
                  ,*(undefined4 *)in_RDI->src,*(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],
                  uVar7,v_mla,0,(int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    pgVar9 = (ggml_tensor *)
             ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                           in_RDI->flags,*(undefined4 *)in_RDI->src,
                           *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar8,v_mla,0,
                           (int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar13);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar13);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar13);
    pvVar18 = in_RCX;
    pgVar4 = pgVar17;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    il_00 = (int)pvVar18;
    type_gate = (llm_ffn_gate_type)pgVar17;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    pgVar16 = name;
    pgVar15 = pgVar9;
    sqrtf((float)uVar1);
    pgVar10 = (ggml_tensor *)CONCAT44(uVar14,iVar19);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    pgVar17 = name;
    pgVar6 = pgVar9;
    local_48 = llm_graph_context::build_attn
                         ((llm_graph_context *)pgVar15,(llm_graph_input_attn_kv_unified *)pgVar16,
                          (ggml_cgraph *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI,
                          q_cur,pgVar11,(ggml_tensor *)CONCAT44(iVar19,in_stack_ffffffffffffff98),
                          pgVar4,v_mla,(float)((ulong)pgVar3 >> 0x20),il_01);
    type_op = (llm_ffn_op_type)pgVar6;
    iVar13 = (int)((ulong)pgVar9 >> 0x20);
    if ((long)iVar19 == in_RDI->ne[3] + -1) {
      in_stack_fffffffffffffe60 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffde0);
      in_stack_ffffffffffffff70 = in_stack_fffffffffffffe60;
      local_48 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_48,in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe58 = local_48;
      in_stack_fffffffffffffe50 =
           (ggml_tensor *)ggml_get_rows(in_RDI->src[5],pgVar11,in_stack_ffffffffffffff70);
      pgVar11 = in_stack_fffffffffffffe50;
    }
    pgVar9 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_48,pgVar11);
    pgVar15 = pgVar9;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar13);
    in_stack_ffffffffffffff68 = pgVar15;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar19);
    pgVar10 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffdb0,pgVar10,mw,cur_00,
                         (llm_norm_type)((ulong)name >> 0x20),(int)name);
    pgVar16 = pgVar10;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar13);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    pgVar11 = pvVar5->ffn_up;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    pgVar6 = pvVar5->ffn_up_b;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    in_stack_fffffffffffffd98 = pvVar5->ffn_down;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar19);
    in_stack_fffffffffffffda0 = pvVar5->ffn_down_b;
    in_stack_fffffffffffffdb0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffda8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd90 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffd88 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe28 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)pgVar15,in_stack_fffffffffffffe28,
                    (ggml_tensor *)&stack0xfffffffffffffd88,pgVar6,pgVar11,pgVar10,pgVar16,pgVar9,
                    in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,
                    pgVar17,type_op,type_gate,il_00);
    ggml_add(in_RDI->src[5],in_stack_fffffffffffffe28,in_stack_ffffffffffffff68);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    pgVar11 = llm_graph_context::build_cvec(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,0);
    in_stack_fffffffffffffdf0 = pgVar11;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  }
  pgVar4 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                      in_stack_fffffffffffffd98,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                      (int)in_stack_fffffffffffffd90);
  pgVar11 = pgVar4;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (char *)in_stack_fffffffffffffd90,iVar13);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4f659d);
  plVar12->t_embd = pgVar4;
  pgVar11 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)in_stack_fffffffffffffdf0,pgVar11,
                       in_stack_fffffffffffffde0);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (char *)in_stack_fffffffffffffd90,iVar13);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4f6622);
  plVar12->t_logits = pgVar11;
  ggml_build_forward_expand(in_RCX,pgVar11);
  return;
}

Assistant:

llm_build_nemotron(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        //GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm,
                    model.layers[il].ffn_norm_b,
                    LLM_NORM, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                    NULL,                      NULL,                        NULL,
                    model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                    NULL,
                    LLM_FFN_RELU_SQR, LLM_FFN_SEQ, il);

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }